

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QConcatenateTablesProxyModelPrivate::ModelInfo>::relocate
          (QArrayDataPointer<QConcatenateTablesProxyModelPrivate::ModelInfo> *this,qsizetype offset,
          ModelInfo **data)

{
  ModelInfo *d_first;
  ModelInfo *pMVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QConcatenateTablesProxyModelPrivate::ModelInfo,long_long>
            (this->ptr,this->size,d_first);
  if (data != (ModelInfo **)0x0) {
    pMVar1 = *data;
    if ((this->ptr <= pMVar1) && (pMVar1 < this->ptr + this->size)) {
      *data = pMVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }